

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O3

sequence * toml::detail::syntax::local_date(sequence *__return_storage_ptr__,spec *s)

{
  repeat_exact local_98;
  repeat_exact local_80;
  repeat_exact local_68;
  character local_50;
  character local_40;
  
  local_80.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_0055fa80;
  local_80.length_ = 4;
  local_80.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x18);
  *(undefined ***)
   local_80.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__digit_00560750;
  *(undefined ***)
   ((long)local_80.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
       &PTR__scanner_base_0055f920;
  *(undefined2 *)
   ((long)local_80.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) = 0x3930;
  local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0055f860;
  local_40.value_ = '-';
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_0055fa80;
  local_98.length_ = 2;
  local_98.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x18);
  *(undefined ***)
   local_98.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__digit_00560750;
  *(undefined ***)
   ((long)local_98.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
       &PTR__scanner_base_0055f920;
  *(undefined2 *)
   ((long)local_98.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) = 0x3930;
  local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0055f860;
  local_50.value_ = '-';
  local_68.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_0055fa80;
  local_68.length_ = 2;
  local_68.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x18);
  *(undefined ***)
   local_68.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__digit_00560750;
  *(undefined ***)
   ((long)local_68.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
       &PTR__scanner_base_0055f920;
  *(undefined2 *)
   ((long)local_68.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) = 0x3930;
  sequence::
  sequence<toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact>
            (__return_storage_ptr__,&local_80,&local_40,&local_98,&local_50,&local_68);
  if (local_68.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_68.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  if (local_98.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_98.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  if (local_80.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_80.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence local_date(const spec& s)
{
    return sequence(
            repeat_exact(4, digit(s)),
            character('-'),
            repeat_exact(2, digit(s)),
            character('-'),
            repeat_exact(2, digit(s))
        );
}